

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleAbstractSpinBox::lineEditIface(QAccessibleAbstractSpinBox *this)

{
  QAccessibleLineEdit *this_00;
  QAbstractSpinBox *this_01;
  QWidget *w;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit == (QAccessibleLineEdit *)0x0) {
    this_00 = (QAccessibleLineEdit *)operator_new(0x30);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_01 = (QAbstractSpinBox *)QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
    w = &QAbstractSpinBox::lineEdit(this_01)->super_QWidget;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    QAccessibleLineEdit::QAccessibleLineEdit(this_00,w,&local_38);
    this->lineEdit = this_00;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QAccessibleInterface *)this->lineEdit;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractSpinBox::lineEditIface() const
{
#if QT_CONFIG(lineedit)
    // QAccessibleLineEdit is only used to forward the text functions
    if (!lineEdit)
        lineEdit = new QAccessibleLineEdit(abstractSpinBox()->lineEdit());
    return lineEdit;
#else
    return nullptr;
#endif
}